

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O1

string * __thiscall
iDynTree::ExternalMesh::getFileLocationOnLocalFileSystem_abi_cxx11_
          (string *__return_storage_ptr__,ExternalMesh *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __buckets_ptr pp_Var2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pcVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  istream *piVar9;
  FILE *pFVar10;
  ulong uVar11;
  string *psVar12;
  long *plVar13;
  __node_base _Var14;
  long lVar15;
  bool bVar16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string individualPath;
  string *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envListShare;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  envListPrefix;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pathList;
  stringstream env_var_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string *local_260;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_258;
  size_t local_250;
  undefined1 local_248 [32];
  size_type local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  ulong local_200;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_1f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1f0;
  undefined1 local_1b8 [32];
  long *local_198 [2];
  long local_188 [10];
  ios_base local_138 [264];
  
  local_1f0._M_buckets = &local_1f0._M_single_bucket;
  local_1f0._M_bucket_count = 1;
  local_1f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1f0._M_element_count = 0;
  local_1f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1f0._M_rehash_policy._M_next_resize = 0;
  local_1f0._M_single_bucket = (__node_base_ptr)0x0;
  pbVar3 = (this->packageDirs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->packageDirs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_260 = __return_storage_ptr__;
  if (pbVar3 == pbVar4) {
    pp_Var2 = (__buckets_ptr)(local_1b8 + 0x10);
    local_1b8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"GAZEBO_MODEL_PATH","");
    plVar13 = local_188;
    local_198[0] = plVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"ROS_PACKAGE_PATH","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_1b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_248 + 0x18),__l,(allocator_type *)&local_280);
    lVar15 = -0x40;
    do {
      if (plVar13 != (long *)plVar13[-2]) {
        operator_delete((long *)plVar13[-2],*plVar13 + 1);
      }
      plVar13 = plVar13 + -4;
      lVar15 = lVar15 + 0x20;
    } while (lVar15 != 0);
    local_1b8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"AMENT_PREFIX_PATH","");
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_1b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_218,__l_00,(allocator_type *)&local_280);
    local_248._16_8_ = this;
    if ((__buckets_ptr)local_1b8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    if (local_228 != local_248._24_8_) {
      uVar11 = 0;
      do {
        pcVar7 = getenv(*(char **)(local_248._24_8_ + uVar11 * 0x20));
        if (pcVar7 != (char *)0x0) {
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          sVar8 = strlen(pcVar7);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_280,pcVar7,pcVar7 + sVar8);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_280,_S_out|_S_in);
          paVar1 = &local_280.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != paVar1) {
            operator_delete(local_280._M_dataplus._M_p,
                            CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                     local_280.field_2._M_local_buf[0]) + 1);
          }
          local_280._M_string_length = 0;
          local_280.field_2._M_local_buf[0] = '\0';
          local_280._M_dataplus._M_p = (pointer)paVar1;
          while (piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)local_1b8,(string *)&local_280,':'),
                ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
            local_258 = &local_1f0;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_1f0,&local_280,&local_258);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != paVar1) {
            operator_delete(local_280._M_dataplus._M_p,
                            CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                     local_280.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)(local_228 - local_248._24_8_) >> 5));
    }
    if (local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar11 = 0;
      do {
        local_200 = uVar11;
        pcVar7 = getenv(local_218.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
        if (pcVar7 != (char *)0x0) {
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          sVar8 = strlen(pcVar7);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_280,pcVar7,pcVar7 + sVar8);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_280,_S_out|_S_in);
          paVar1 = &local_280.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != paVar1) {
            operator_delete(local_280._M_dataplus._M_p,
                            CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                     local_280.field_2._M_local_buf[0]) + 1);
          }
          local_280._M_string_length = 0;
          local_280.field_2._M_local_buf[0] = '\0';
          local_280._M_dataplus._M_p = (pointer)paVar1;
          while (piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)local_1b8,(string *)&local_280,':'),
                ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
            local_258 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_248;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_258,local_280._M_dataplus._M_p,
                       local_280._M_dataplus._M_p + local_280._M_string_length);
            std::__cxx11::string::append((char *)&local_258);
            local_1f8 = &local_1f0;
            std::
            _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                      ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&local_1f0,(string *)&local_258,&local_1f8);
            if (local_258 !=
                (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_248) {
              operator_delete(local_258,local_248._0_8_ + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != paVar1) {
            operator_delete(local_280._M_dataplus._M_p,
                            CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                     local_280.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        uVar11 = local_200 + 1;
      } while (uVar11 < (ulong)((long)local_218.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_218.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_248 + 0x18));
    this = (ExternalMesh *)local_248._16_8_;
  }
  else {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)local_1b8,pbVar3,pbVar4,0,&local_280,&local_258,local_248 + 0x18);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::_M_move_assign(&local_1f0,local_1b8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_1b8);
  }
  local_258 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"package:/","");
  pFVar10 = fopen((this->filename)._M_dataplus._M_p,"r");
  if (pFVar10 == (FILE *)0x0) {
    std::__cxx11::string::substr((ulong)local_1b8,(ulong)&this->filename);
    if (local_1b8._8_8_ == local_250) {
      if (local_1b8._8_8_ == 0) {
        bVar16 = true;
      }
      else {
        iVar6 = bcmp((void *)local_1b8._0_8_,local_258,local_1b8._8_8_);
        bVar16 = iVar6 == 0;
      }
    }
    else {
      bVar16 = false;
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    if (bVar16) {
      pcVar5 = (this->filename)._M_dataplus._M_p;
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,pcVar5,pcVar5 + (this->filename)._M_string_length);
      local_248._16_8_ = this;
      std::__cxx11::string::erase((ulong)local_1b8,0);
      bVar16 = local_1f0._M_before_begin._M_nxt == (_Hash_node_base *)0x0;
      if (!bVar16) {
        paVar1 = &local_260->field_2;
        bVar16 = false;
        _Var14._M_nxt = local_1f0._M_before_begin._M_nxt;
        do {
          std::operator+(&local_280,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (_Var14._M_nxt + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8);
          psVar12 = local_260;
          (local_260->_M_dataplus)._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_260,local_280._M_dataplus._M_p,
                     local_280._M_dataplus._M_p + local_280._M_string_length);
          if (psVar12->_M_string_length != 0) {
            uVar11 = 0;
            do {
              pcVar5 = (psVar12->_M_dataplus)._M_p;
              if (pcVar5[uVar11] == '\\') {
                pcVar5[uVar11] = '/';
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < psVar12->_M_string_length);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,
                            CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                     local_280.field_2._M_local_buf[0]) + 1);
            psVar12 = local_260;
          }
          pFVar10 = fopen((psVar12->_M_dataplus)._M_p,"r");
          if (pFVar10 != (FILE *)0x0) {
            fclose(pFVar10);
            break;
          }
          pcVar5 = (psVar12->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar1) {
            operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
          }
          _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
          bVar16 = _Var14._M_nxt == (_Hash_node_base *)0x0;
        } while (!bVar16);
      }
      this = (ExternalMesh *)local_248._16_8_;
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
      }
      if (!bVar16) goto LAB_00162f6b;
    }
  }
  else {
    fclose(pFVar10);
  }
  (local_260->_M_dataplus)._M_p = (pointer)&local_260->field_2;
  pcVar5 = (this->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_260,pcVar5,pcVar5 + (this->filename)._M_string_length);
LAB_00162f6b:
  if (local_258 !=
      (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)local_248) {
    operator_delete(local_258,local_248._0_8_ + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1f0);
  return local_260;
}

Assistant:

std::string ExternalMesh::getFileLocationOnLocalFileSystem() const
    {
        bool isWindows = false;
    #ifdef _WIN32
        isWindows = true;
    #endif

        std::unordered_set<std::string> pathList;

        // if the user provides the packageDirs we do not check inside the dirs listed in the
        // environment variables
        if (!this->packageDirs.empty())
        {
            pathList = std::unordered_set<std::string>(this->packageDirs.begin(),
                                                       this->packageDirs.end());
        } else {
            // List of variables that contain <prefix>/share paths
            std::vector<std::string> envListShare = {"GAZEBO_MODEL_PATH", "ROS_PACKAGE_PATH"};
            // List of variables that contains <prefix> paths (to which /share needs to be added)
            std::vector<std::string> envListPrefix = {"AMENT_PREFIX_PATH"};

            for (size_t i = 0; i < envListShare.size(); ++i)
            {
                const char * env_var_value = std::getenv(envListShare[i].c_str());

                if (env_var_value)
                {
                    std::stringstream env_var_string(env_var_value);

                    std::string individualPath;

                    while(std::getline(env_var_string, individualPath, isWindows ? ';' : ':'))
                    {
                        pathList.insert(individualPath);
                    }
                }
            }

            for (size_t i = 0; i < envListPrefix.size(); ++i)
            {
                const char * env_var_value = std::getenv(envListPrefix[i].c_str());

                if (env_var_value)
                {
                    std::stringstream env_var_string(env_var_value);

                    std::string individualPath;

                    while(std::getline(env_var_string, individualPath, isWindows ? ';' : ':'))
                    {
                        pathList.insert(individualPath + "/share");
                    }
                }
            }
        }
        auto cleanPathSeparator = [isWindows](const std::string& filename)->std::string
        {
            std::string output = filename;
            char pathSeparator = isWindows ? '\\' : '/';
            char wrongPathSeparator = isWindows ? '/' : '\\';

            for (size_t i = 0; i < output.size(); ++i)
            {
                if (output[i] == wrongPathSeparator)
                {
                    output[i] = pathSeparator;
                }
            }

            return output;

        };

        auto isFileExisting = [](const std::string& filename)->bool
        {
            if (FILE *file = fopen(filename.c_str(), "r")) {
                fclose(file);
                return true;
            } else {
                return false;
            }
        };

        auto getFilePath = [isFileExisting, cleanPathSeparator](const std::string& filename, const std::string& prefixToRemove, const std::unordered_set<std::string>& paths)
        {
            if(isFileExisting(filename))
            {
                return filename;
            }

            if (filename.substr(0, prefixToRemove.size()) == prefixToRemove)
            {
                std::string filename_noprefix = filename;
                filename_noprefix.erase(0, prefixToRemove.size());
                for (const std::string& path : paths)
                {
                    const std::string testPath  = cleanPathSeparator(path + filename_noprefix);
                    if (isFileExisting(testPath))
                    {
                        return testPath;
                    }
                }

            }

            return filename; //By default return the input;
        };

        return getFilePath(filename, "package:/", pathList);
    }